

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

bool __thiscall FBehavior::Init(FBehavior *this,int lumpnum,FileReader *fr,int len)

{
  char *to;
  BYTE *pBVar1;
  byte bVar2;
  char cVar3;
  SDWORD *pSVar4;
  SDWORD *pSVar5;
  ScriptFunction *pSVar6;
  ACSFormat AVar7;
  DWORD DVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  BYTE *chunk_1;
  BYTE *pBVar12;
  ACSProfileInfo *pAVar13;
  ulong *puVar14;
  ArrayInfo *pAVar15;
  void *__s;
  ArrayInfo **ppAVar16;
  char *pcVar17;
  FBehavior *pFVar18;
  uint uVar19;
  int *piVar20;
  uint *puVar21;
  uint uVar22;
  ACSProfileInfo *pAVar23;
  long lVar24;
  int *piVar25;
  uint uVar26;
  DWORD *pDVar27;
  ScriptFunction *pSVar28;
  ulong uVar29;
  ulong uVar30;
  int *piVar31;
  long lVar32;
  BYTE *chunk;
  ulong uVar33;
  
  this->LumpNum = lumpnum;
  if (fr == (FileReader *)0x0) {
    len = FWadCollection::LumpLength(&Wads,lumpnum);
  }
  if (0x1f < len) {
    uVar33 = (ulong)(uint)len;
    pBVar12 = (BYTE *)operator_new__(uVar33);
    if (fr == (FileReader *)0x0) {
      FWadCollection::ReadLump(&Wads,lumpnum,pBVar12);
    }
    else {
      (*(fr->super_FileReaderBase)._vptr_FileReaderBase[2])(fr,pBVar12,uVar33);
    }
    if (((*pBVar12 == 'A') && (pBVar12[1] == 'C')) && (pBVar12[2] == 'S')) {
      bVar2 = pBVar12[3];
      AVar7 = (ACSFormat)bVar2;
      if (bVar2 == 0) {
LAB_004d30d3:
        this->Format = AVar7;
        TArray<FBehavior_*,_FBehavior_*>::Grow(&StaticModules,1);
        StaticModules.Array[StaticModules.Count] = this;
        DVar8 = StaticModules.Count << 0x14;
        to = this->ModuleName;
        StaticModules.Count = StaticModules.Count + 1;
        this->LibraryID = DVar8;
        if (fr == (FileReader *)0x0) {
          FWadCollection::GetLumpName(&Wads,to,lumpnum);
          this->ModuleName[8] = '\0';
        }
        else {
          builtin_strncpy(to,"BEHAVIOR",9);
        }
        this->Data = pBVar12;
        this->DataSize = len;
        uVar10 = *(uint *)(pBVar12 + 4);
        pBVar1 = pBVar12 + uVar10;
        if (this->Format == ACS_Old) {
          uVar19 = *(uint *)(pBVar1 + -4);
          this->Chunks = pBVar12 + uVar33;
          if ((0x17 < uVar10) && ((uVar19 | 0x20000000) == 0x65534341)) {
            this->Format = (uVar19 == 0x65534341) + ACS_Enhanced;
            this->Chunks = pBVar12 + *(uint *)(pBVar1 + -8);
            this->DataSize = uVar10 - 8;
          }
        }
        else {
          this->Chunks = pBVar1;
        }
        pFVar18 = this;
        LoadScriptsDirectory(this);
        if (this->Format == ACS_Old) {
          pBVar12 = this->Data;
          uVar10 = *(uint *)(pBVar12 + 4);
          this->StringTable = uVar10;
          uVar10 = uVar10 + *(int *)(pBVar12 + uVar10) * 0xc + 4;
          this->StringTable = uVar10;
          UnescapeStringTable(pFVar18,pBVar12 + uVar10,pBVar12,false);
        }
        else {
          UnencryptStrings(this);
          piVar20 = (int *)this->Chunks;
          if (piVar20 != (int *)0x0) {
            for (; piVar20 < this->Data + this->DataSize;
                piVar20 = (int *)((long)piVar20 + (ulong)(piVar20[1] + 8))) {
              if (*piVar20 == 0x4c525453) goto LAB_004d3215;
            }
          }
          piVar20 = (int *)0x0;
LAB_004d3215:
          if (piVar20 == (int *)0x0) {
            this->StringTable = 0;
          }
          else {
            this->StringTable = ((int)piVar20 - *(int *)&this->Data) + 8;
            if (piVar20[3] != 0) {
              uVar33 = 0;
              do {
                strbin((char *)((long)piVar20 + (long)piVar20[(ulong)((int)uVar33 + 3) + 2] + 8));
                uVar33 = uVar33 + 1;
              } while (uVar33 < (uint)piVar20[3]);
            }
          }
        }
        if (this->Format == ACS_Old) {
          lVar24 = 0;
          do {
            *(long *)((long)this->MapVars + lVar24 * 2) = (long)this->MapVarStore + lVar24;
            lVar24 = lVar24 + 4;
          } while (lVar24 != 0x200);
        }
        else {
          this->Functions = (ScriptFunction *)0x0;
          piVar20 = (int *)this->Chunks;
          if (piVar20 != (int *)0x0) {
            for (piVar31 = piVar20; piVar31 < this->Data + this->DataSize;
                piVar31 = (int *)((long)piVar31 + (ulong)(piVar31[1] + 8))) {
              if (*piVar31 == 0x434e5546) goto LAB_004d32eb;
            }
          }
          piVar31 = (int *)0x0;
LAB_004d32eb:
          if (piVar31 != (int *)0x0) {
            uVar10 = piVar31[1];
            uVar19 = uVar10 >> 3;
            this->NumFunctions = uVar19;
            pAVar13 = (ACSProfileInfo *)operator_new__((ulong)(uVar10 & 0xfffffff8) * 3);
            if (7 < uVar10) {
              pAVar23 = pAVar13;
              do {
                pAVar23->TotalInstr = 0;
                pAVar23->NumRuns = 0;
                pAVar23->MinInstrPerRun = 0xffffffff;
                pAVar23->MaxInstrPerRun = 0;
                pAVar23 = pAVar23 + 1;
              } while (pAVar23 != pAVar13 + uVar19);
            }
            this->FunctionProfileData = pAVar13;
            puVar14 = (ulong *)operator_new__((ulong)uVar19 << 5 | 8);
            *puVar14 = (ulong)uVar19;
            if (7 < uVar10) {
              lVar24 = 0;
              do {
                *(undefined4 *)((long)puVar14 + lVar24 + 0x18) = 0;
                *(undefined8 *)((long)puVar14 + lVar24 + 0x20) = 0;
                lVar24 = lVar24 + 0x20;
              } while ((ulong)uVar19 << 5 != lVar24);
            }
            this->Functions = (ScriptFunction *)(puVar14 + 1);
            if (7 < uVar10) {
              uVar33 = 0;
              do {
                (&((ScriptFunction *)(puVar14 + 1))->ArgCount)[uVar33 * 4] =
                     *(BYTE *)((long)piVar31 + uVar33 + 8);
                *(undefined1 *)((long)puVar14 + uVar33 * 4 + 9) =
                     *(undefined1 *)((long)piVar31 + uVar33 + 10);
                *(undefined1 *)((long)puVar14 + uVar33 * 4 + 10) =
                     *(undefined1 *)((long)piVar31 + uVar33 + 0xb);
                *(uint *)((long)puVar14 + uVar33 * 4 + 0xc) =
                     (uint)*(byte *)((long)piVar31 + uVar33 + 9);
                *(undefined4 *)((long)puVar14 + uVar33 * 4 + 0x10) =
                     *(undefined4 *)((long)piVar31 + uVar33 + 0xc);
                uVar33 = uVar33 + 8;
              } while (uVar19 * 8 != uVar33);
            }
          }
          if (0 < this->NumFunctions) {
            if (piVar20 != (int *)0x0) {
              for (; piVar20 < this->Data + this->DataSize;
                  piVar20 = (int *)((long)piVar20 + (ulong)(piVar20[1] + 8))) {
                if (*piVar20 == 0x59524146) goto joined_r0x004d3446;
              }
            }
            piVar20 = (int *)0x0;
joined_r0x004d3446:
            if (piVar20 != (int *)0x0) {
              if ((5 < piVar20[1]) && ((uint)*(ushort *)(piVar20 + 2) < (uint)this->NumFunctions)) {
                pSVar6 = this->Functions + *(ushort *)(piVar20 + 2);
                iVar9 = ParseLocalArrayChunk
                                  (piVar20,&pSVar6->LocalArrays,
                                   (uint)pSVar6->ArgCount + pSVar6->LocalCount);
                pSVar6->LocalCount = iVar9 - (uint)pSVar6->ArgCount;
              }
              piVar31 = (int *)((ulong)(piVar20[1] + 8) + (long)piVar20);
              if (piVar31 < this->Data + this->DataSize) {
                iVar9 = *piVar20;
                do {
                  piVar20 = piVar31;
                  if (*piVar31 == iVar9) goto joined_r0x004d3446;
                  piVar31 = (int *)((long)piVar31 + (ulong)(piVar31[1] + 8));
                } while (piVar31 < this->Data + this->DataSize);
              }
              piVar20 = (int *)0x0;
              goto joined_r0x004d3446;
            }
          }
          piVar20 = (int *)this->Chunks;
          if (piVar20 != (int *)0x0) {
            for (; piVar20 < this->Data + this->DataSize;
                piVar20 = (int *)((long)piVar20 + (ulong)(piVar20[1] + 8))) {
              if (*piVar20 == 0x504d554a) goto LAB_004d3506;
            }
          }
          piVar20 = (int *)0x0;
LAB_004d3506:
          if ((piVar20 != (int *)0x0) && (0 < piVar20[1])) {
            lVar24 = 0;
            do {
              iVar9 = *(int *)((long)piVar20 + lVar24 + 8);
              TArray<int,_int>::Grow(&this->JumpPoints,1);
              (this->JumpPoints).Array[(this->JumpPoints).Count] = iVar9;
              puVar21 = &(this->JumpPoints).Count;
              *puVar21 = *puVar21 + 1;
              lVar24 = lVar24 + 4;
            } while ((int)lVar24 < piVar20[1]);
          }
          pSVar5 = this->MapVarStore;
          memset(pSVar5,0,0x200);
          piVar20 = (int *)this->Chunks;
          if (piVar20 != (int *)0x0) {
            for (; piVar20 < this->Data + this->DataSize;
                piVar20 = (int *)((long)piVar20 + (ulong)(piVar20[1] + 8))) {
              if (*piVar20 == 0x494e494d) goto LAB_004d3599;
            }
          }
          piVar20 = (int *)0x0;
LAB_004d3599:
          if (piVar20 != (int *)0x0) {
            pBVar12 = this->Data;
            do {
              uVar10 = piVar20[1];
              if (7 < uVar10) {
                iVar9 = piVar20[2];
                uVar33 = 0;
                do {
                  pSVar5[(long)iVar9 + uVar33] = piVar20[uVar33 + 3];
                  uVar33 = uVar33 + 1;
                } while ((uVar10 >> 2) - 1 != uVar33);
              }
              piVar31 = (int *)((ulong)(piVar20[1] + 8) + (long)piVar20);
              if (piVar31 < pBVar12 + this->DataSize) {
                iVar9 = *piVar20;
                do {
                  piVar20 = piVar31;
                  if (*piVar31 == iVar9) goto LAB_004d35fb;
                  piVar31 = (int *)((long)piVar31 + (ulong)(piVar31[1] + 8));
                } while (piVar31 < pBVar12 + this->DataSize);
              }
              piVar20 = (int *)0x0;
LAB_004d35fb:
            } while (piVar20 != (int *)0x0);
          }
          lVar24 = 0;
          do {
            *(long *)((long)this->MapVars + lVar24 * 2) = (long)this->MapVarStore + lVar24;
            lVar24 = lVar24 + 4;
          } while (lVar24 != 0x200);
          piVar20 = (int *)this->Chunks;
          if (piVar20 != (int *)0x0) {
            for (; piVar20 < this->Data + this->DataSize;
                piVar20 = (int *)((long)piVar20 + (ulong)(piVar20[1] + 8))) {
              if (*piVar20 == 0x59415241) goto LAB_004d365a;
            }
          }
          piVar20 = (int *)0x0;
LAB_004d365a:
          if (piVar20 != (int *)0x0) {
            uVar10 = piVar20[1];
            uVar19 = uVar10 >> 3;
            this->NumArrays = uVar19;
            pAVar15 = (ArrayInfo *)operator_new__((ulong)uVar19 << 4);
            this->ArrayStore = pAVar15;
            memset(pAVar15,0,(ulong)(uVar10 & 0xfffffff8));
            if (0 < this->NumArrays) {
              lVar24 = 8;
              lVar32 = 0;
              do {
                this->MapVarStore[(uint)piVar20[lVar32 * 2 + 2]] = (SDWORD)lVar32;
                uVar10 = piVar20[lVar32 * 2 + 3];
                pAVar15 = this->ArrayStore;
                *(uint *)((long)pAVar15 + lVar24 + -8) = uVar10;
                __s = operator_new__((ulong)uVar10 << 2);
                *(void **)((long)&pAVar15->ArraySize + lVar24) = __s;
                memset(__s,0,(ulong)*(uint *)((long)pAVar15 + lVar24 + -8) << 2);
                lVar32 = lVar32 + 1;
                lVar24 = lVar24 + 0x10;
              } while (lVar32 < this->NumArrays);
            }
          }
          piVar20 = (int *)this->Chunks;
          if (piVar20 != (int *)0x0) {
            for (piVar31 = piVar20; piVar31 < this->Data + this->DataSize;
                piVar31 = (int *)((long)piVar31 + (ulong)(piVar31[1] + 8))) {
              if (*piVar31 == 0x494e4941) goto LAB_004d373c;
            }
          }
          piVar31 = (int *)0x0;
LAB_004d373c:
          if (piVar31 != (int *)0x0) {
            pBVar12 = this->Data;
            pAVar15 = this->ArrayStore;
            do {
              uVar10 = this->MapVarStore[(uint)piVar31[2]];
              if (uVar10 < (uint)this->NumArrays) {
                uVar19 = pAVar15[(int)uVar10].ArraySize;
                uVar26 = piVar31[1] - 4U >> 2;
                if (uVar19 < uVar26) {
                  uVar26 = uVar19;
                }
                if (uVar26 != 0) {
                  pSVar4 = pAVar15[(int)uVar10].Elements;
                  uVar33 = 0;
                  do {
                    pSVar4[uVar33] = piVar31[uVar33 + 3];
                    uVar33 = uVar33 + 1;
                  } while (uVar26 != uVar33);
                }
              }
              piVar25 = (int *)((ulong)(piVar31[1] + 8) + (long)piVar31);
              if (piVar25 < pBVar12 + this->DataSize) {
                iVar9 = *piVar31;
                do {
                  piVar31 = piVar25;
                  if (*piVar25 == iVar9) goto LAB_004d37d3;
                  piVar25 = (int *)((long)piVar25 + (ulong)(piVar25[1] + 8));
                } while (piVar25 < pBVar12 + this->DataSize);
              }
              piVar31 = (int *)0x0;
LAB_004d37d3:
            } while (piVar31 != (int *)0x0);
          }
          uVar10 = this->NumArrays;
          this->NumTotalArrays = uVar10;
          if (piVar20 != (int *)0x0) {
            for (; piVar20 < this->Data + this->DataSize;
                piVar20 = (int *)((long)piVar20 + (ulong)(piVar20[1] + 8))) {
              if (*piVar20 == 0x504d4941) goto LAB_004d381a;
            }
          }
          piVar20 = (int *)0x0;
LAB_004d381a:
          if (piVar20 != (int *)0x0) {
            this->NumTotalArrays = piVar20[2] + uVar10;
          }
          iVar9 = this->NumTotalArrays;
          if ((long)iVar9 != 0) {
            uVar33 = 0xffffffffffffffff;
            if (-1 < iVar9) {
              uVar33 = (long)iVar9 << 3;
            }
            ppAVar16 = (ArrayInfo **)operator_new__(uVar33);
            this->Arrays = ppAVar16;
            if (0 < (int)uVar10) {
              lVar24 = 0;
              lVar32 = 0;
              do {
                *(long *)((long)this->Arrays + lVar32 * 2) =
                     (long)&this->ArrayStore->ArraySize + lVar24;
                lVar32 = lVar32 + 4;
                lVar24 = lVar24 + 0x10;
              } while ((ulong)uVar10 << 4 != lVar24);
            }
          }
          if (this->LibraryID != 0) {
            piVar20 = (int *)this->Chunks;
            if (piVar20 != (int *)0x0) {
              for (; piVar20 < this->Data + this->DataSize;
                  piVar20 = (int *)((long)piVar20 + (ulong)(piVar20[1] + 8))) {
                if (*piVar20 == 0x5254534d) goto LAB_004d38ce;
              }
            }
            piVar20 = (int *)0x0;
LAB_004d38ce:
            if ((piVar20 != (int *)0x0) && (3 < (uint)piVar20[1])) {
              uVar33 = 0;
              do {
                pcVar17 = LookupString(this,this->MapVarStore[(uint)piVar20[uVar33 + 2]]);
                if (pcVar17 != (char *)0x0) {
                  iVar9 = ACSStringPool::AddString(&GlobalACSStrings,pcVar17);
                  pSVar5[(uint)piVar20[uVar33 + 2]] = iVar9;
                }
                uVar33 = uVar33 + 1;
              } while (uVar33 < (uint)piVar20[1] >> 2);
            }
            piVar20 = (int *)this->Chunks;
            if (piVar20 != (int *)0x0) {
              for (; piVar20 < this->Data + this->DataSize;
                  piVar20 = (int *)((long)piVar20 + (ulong)(piVar20[1] + 8))) {
                if (*piVar20 == 0x52545341) goto LAB_004d3959;
              }
            }
            piVar20 = (int *)0x0;
LAB_004d3959:
            if ((piVar20 != (int *)0x0) && (3 < (uint)piVar20[1])) {
              uVar33 = 0;
              do {
                uVar10 = this->MapVarStore[(uint)piVar20[uVar33 + 2]];
                if (uVar10 < (uint)this->NumArrays) {
                  DVar8 = this->ArrayStore[(int)uVar10].ArraySize;
                  if (0 < (int)DVar8) {
                    pDVar27 = (DWORD *)this->ArrayStore[(int)uVar10].Elements;
                    iVar9 = DVar8 + 1;
                    do {
                      pcVar17 = LookupString(this,*pDVar27);
                      if (pcVar17 != (char *)0x0) {
                        DVar8 = ACSStringPool::AddString(&GlobalACSStrings,pcVar17);
                        *pDVar27 = DVar8;
                      }
                      pDVar27 = pDVar27 + 1;
                      iVar9 = iVar9 + -1;
                    } while (1 < iVar9);
                  }
                }
                uVar33 = uVar33 + 1;
              } while (uVar33 < (uint)piVar20[1] >> 2);
            }
            piVar20 = (int *)this->Chunks;
            if (piVar20 != (int *)0x0) {
              for (; piVar20 < this->Data + this->DataSize;
                  piVar20 = (int *)((long)piVar20 + (ulong)(piVar20[1] + 8))) {
                if (*piVar20 == 0x47415441) goto joined_r0x004d3a13;
              }
            }
            piVar20 = (int *)0x0;
joined_r0x004d3a13:
            if (piVar20 != (int *)0x0) {
              if (((char)piVar20[2] == '\0') &&
                 (uVar10 = this->MapVarStore[*(int *)((long)piVar20 + 9)],
                 uVar10 < (uint)this->NumArrays)) {
                uVar19 = this->ArrayStore[(int)uVar10].ArraySize;
                uVar26 = piVar20[1] - 5U;
                if (uVar19 <= piVar20[1] - 5U) {
                  uVar26 = uVar19;
                }
                if (0 < (int)uVar26) {
                  pSVar5 = this->ArrayStore[(int)uVar10].Elements;
                  iVar9 = uVar26 + 1;
                  lVar24 = 0;
                  do {
                    cVar3 = *(char *)((long)piVar20 + lVar24 + 0xd);
                    if (cVar3 == '\x01') {
                      pcVar17 = LookupString(this,pSVar5[lVar24]);
                      if (pcVar17 != (char *)0x0) {
                        uVar10 = ACSStringPool::AddString(&GlobalACSStrings,pcVar17);
                        goto LAB_004d3aae;
                      }
                    }
                    else if (cVar3 == '\x02') {
                      uVar10 = pSVar5[lVar24] | this->LibraryID;
LAB_004d3aae:
                      pSVar5[lVar24] = uVar10;
                    }
                    iVar9 = iVar9 + -1;
                    lVar24 = lVar24 + 1;
                  } while (1 < iVar9);
                }
              }
              piVar31 = (int *)((ulong)(piVar20[1] + 8) + (long)piVar20);
              if (piVar31 < this->Data + this->DataSize) {
                iVar9 = *piVar20;
                do {
                  piVar20 = piVar31;
                  if (*piVar31 == iVar9) goto joined_r0x004d3a13;
                  piVar31 = (int *)((long)piVar31 + (ulong)(piVar31[1] + 8));
                } while (piVar31 < this->Data + this->DataSize);
              }
              piVar20 = (int *)0x0;
              goto joined_r0x004d3a13;
            }
          }
          piVar20 = (int *)this->Chunks;
          if (piVar20 != (int *)0x0) {
            for (; piVar20 < this->Data + this->DataSize;
                piVar20 = (int *)((long)piVar20 + (ulong)(piVar20[1] + 8))) {
              if (*piVar20 == 0x44414f4c) goto LAB_004d3b35;
            }
          }
          piVar20 = (int *)0x0;
LAB_004d3b35:
          if (piVar20 != (int *)0x0) {
            if (piVar20[1] != 0) {
              uVar33 = 0;
              do {
                uVar10 = (uint)uVar33;
                if (*(char *)((long)piVar20 + uVar33 + 8) != '\0') {
                  pcVar17 = (char *)((long)piVar20 + uVar33 + 8);
                  iVar9 = FWadCollection::CheckNumForName(&Wads,pcVar17,4);
                  if (iVar9 < 0) {
                    Printf("\x1cGCould not find ACS library %s.\n",pcVar17);
                    pFVar18 = (FBehavior *)0x0;
                  }
                  else {
                    pFVar18 = StaticLoadModule(iVar9,(FileReader *)0x0,0);
                  }
                  if (pFVar18 != (FBehavior *)0x0) {
                    TArray<FBehavior_*,_FBehavior_*>::Grow(&this->Imports,1);
                    uVar10 = (this->Imports).Count;
                    (this->Imports).Array[uVar10] = pFVar18;
                    (this->Imports).Count = uVar10 + 1;
                  }
                  do {
                    uVar10 = (int)uVar33 + 1;
                    uVar33 = (ulong)uVar10;
                  } while (*(char *)((long)piVar20 + uVar33 + 8) != '\0');
                }
                uVar33 = (ulong)(uVar10 + 1);
              } while (uVar10 + 1 < (uint)piVar20[1]);
            }
            if ((this->Imports).Count != 0) {
              uVar33 = 0;
              do {
                pFVar18 = (this->Imports).Array[uVar33];
                if (pFVar18 != (FBehavior *)0x0) {
                  piVar20 = (int *)this->Chunks;
                  if (piVar20 != (int *)0x0) {
                    for (; piVar20 < this->Data + this->DataSize;
                        piVar20 = (int *)((long)piVar20 + (ulong)(piVar20[1] + 8))) {
                      if (*piVar20 == 0x4d414e46) goto LAB_004d3c55;
                    }
                  }
                  piVar20 = (int *)0x0;
LAB_004d3c55:
                  if (0 < this->NumFunctions) {
                    lVar32 = 8;
                    lVar24 = 0;
                    do {
                      pSVar6 = this->Functions;
                      if (((*(int *)(&pSVar6->ArgCount + lVar32) == 0) &&
                          (*(char *)((long)pSVar6 + lVar32 + -6) == '\0')) &&
                         (uVar10 = FindFunctionName(pFVar18,(char *)((long)piVar20 +
                                                                    (ulong)(uint)piVar20[lVar24 + 3]
                                                                    + 8)), -1 < (int)uVar10)) {
                        if ((pFVar18->Functions[uVar10].Address != 0) &&
                           (pSVar28 = pFVar18->Functions + uVar10, pSVar28->ImportNum == '\0')) {
                          *(uint *)(&pSVar6->ArgCount + lVar32) = uVar10;
                          *(char *)((long)pSVar6 + lVar32 + -6) = (char)uVar33 + '\x01';
                          if (pSVar28->ArgCount != *(byte *)((long)pSVar6 + lVar32 + -8)) {
                            Printf("\x1cIFunction %s in %s has %d arguments. %s expects it to have %d.\n"
                                   ,(long)piVar20 + (ulong)(uint)piVar20[lVar24 + 3] + 8,
                                   pFVar18->ModuleName,(ulong)pSVar28->ArgCount,to);
                            this->Format = ACS_Unknown;
                          }
                          *(int *)((long)pSVar6 + lVar32 + -4) = pSVar28->LocalCount;
                          *(BYTE *)((long)pSVar6 + lVar32 + -7) = pSVar28->HasReturnValue;
                        }
                      }
                      lVar24 = lVar24 + 1;
                      lVar32 = lVar32 + 0x20;
                    } while (lVar24 < this->NumFunctions);
                  }
                  piVar20 = (int *)this->Chunks;
                  if (piVar20 != (int *)0x0) {
                    for (; piVar20 < this->Data + this->DataSize;
                        piVar20 = (int *)((long)piVar20 + (ulong)(piVar20[1] + 8))) {
                      if (*piVar20 == 0x504d494d) goto LAB_004d3d95;
                    }
                  }
                  piVar20 = (int *)0x0;
LAB_004d3d95:
                  if ((piVar20 != (int *)0x0) && (uVar10 = piVar20[1], uVar10 != 0)) {
                    uVar29 = 0;
                    do {
                      uVar19 = FindMapVarName(pFVar18,(char *)((long)piVar20 +
                                                              (ulong)((int)uVar29 + 4) + 8));
                      if (-1 < (int)uVar19) {
                        this->MapVars[*(uint *)((long)piVar20 + uVar29 + 8)] =
                             pFVar18->MapVarStore + uVar19;
                      }
                      uVar30 = (ulong)((int)uVar29 + 5);
                      do {
                        uVar19 = (int)uVar30 + 1;
                        uVar29 = (ulong)uVar19;
                        lVar24 = uVar30 + 8;
                        uVar30 = uVar29;
                      } while (*(char *)((long)piVar20 + lVar24) != '\0');
                    } while (uVar19 < uVar10);
                  }
                  if (this->NumArrays < this->NumTotalArrays) {
                    piVar20 = (int *)this->Chunks;
                    if (piVar20 != (int *)0x0) {
                      for (; piVar20 < this->Data + this->DataSize;
                          piVar20 = (int *)((long)piVar20 + (ulong)(piVar20[1] + 8))) {
                        if (*piVar20 == 0x504d4941) goto LAB_004d3e3a;
                      }
                    }
                    piVar20 = (int *)0x0;
LAB_004d3e3a:
                    if (piVar20[2] != 0) {
                      puVar21 = (uint *)(piVar20 + 3);
                      uVar10 = 0;
                      do {
                        uVar19 = *puVar21;
                        uVar26 = puVar21[1];
                        uVar11 = FindMapVarName(pFVar18,(char *)(puVar21 + 2));
                        if ((int)uVar11 < 0) {
                          uVar11 = 0xffffffff;
                        }
                        else {
                          uVar11 = pFVar18->MapVarStore[uVar11];
                        }
                        if (-1 < (int)uVar11) {
                          uVar22 = this->NumArrays + uVar10;
                          this->Arrays[uVar22] = pFVar18->ArrayStore + uVar11;
                          this->MapVarStore[uVar19] = uVar22;
                          uVar19 = pFVar18->ArrayStore[uVar11].ArraySize;
                          if (uVar19 != uVar26) {
                            this->Format = ACS_Unknown;
                            Printf("\x1cIThe array %s in %s has %u elements, but %s expects it to only have %u.\n"
                                   ,puVar21 + 2,pFVar18->ModuleName,(ulong)uVar19,to,(ulong)uVar26);
                          }
                        }
                        puVar21 = (uint *)((long)puVar21 + 9);
                        do {
                          uVar19 = *puVar21;
                          puVar21 = (uint *)((long)puVar21 + 1);
                        } while ((char)uVar19 != '\0');
                        uVar10 = uVar10 + 1;
                      } while (uVar10 < (uint)piVar20[2]);
                    }
                  }
                }
                uVar33 = uVar33 + 1;
              } while (uVar33 < (this->Imports).Count);
            }
          }
        }
        DPrintf(3,"Loaded %d scripts, %d functions\n",(ulong)(uint)this->NumScripts,
                (ulong)(uint)this->NumFunctions);
        return true;
      }
      if (bVar2 == 0x65) {
        AVar7 = ACS_LittleEnhanced;
        goto LAB_004d30d3;
      }
      if (bVar2 == 0x45) {
        AVar7 = ACS_Enhanced;
        goto LAB_004d30d3;
      }
    }
    operator_delete__(pBVar12);
  }
  return false;
}

Assistant:

bool FBehavior::Init(int lumpnum, FileReader * fr, int len)
{
	BYTE *object;
	int i;

	LumpNum = lumpnum;

	// Now that everything is set up, record this module as being among the loaded modules.
	// We need to do this before resolving any imports, because an import might (indirectly)
	// need to resolve exports in this module. The only things that can be exported are
	// functions and map variables, which must already be present if they're exported, so
	// this is okay.

	// This must be done first for 2 reasons:
	// 1. If not, corrupt modules cause memory leaks
	// 2. Corrupt modules won't be reported when a level is being loaded if this function quits before
	//    adding it to the list.

	if (fr == NULL) len = Wads.LumpLength (lumpnum);



	// Any behaviors smaller than 32 bytes cannot possibly contain anything useful.
	// (16 bytes for a completely empty behavior + 12 bytes for one script header
	//  + 4 bytes for PCD_TERMINATE for an old-style object. A new-style object
	// has 24 bytes if it is completely empty. An empty SPTR chunk adds 8 bytes.)
	if (len < 32)
	{
		return false;
	}

	object = new BYTE[len];
	if (fr == NULL)
	{
		Wads.ReadLump (lumpnum, object);
	}
	else
	{
		fr->Read (object, len);
	}

	if (object[0] != 'A' || object[1] != 'C' || object[2] != 'S')
	{
		delete[] object;
		return false;
	}

	switch (object[3])
	{
	case 0:
		Format = ACS_Old;
		break;
	case 'E':
		Format = ACS_Enhanced;
		break;
	case 'e':
		Format = ACS_LittleEnhanced;
		break;
	default:
		delete[] object;
		return false;
	}
    LibraryID = StaticModules.Push (this) << LIBRARYID_SHIFT;

	if (fr == NULL)
	{
		Wads.GetLumpName (ModuleName, lumpnum);
		ModuleName[8] = 0;
	}
	else
	{
		strcpy(ModuleName, "BEHAVIOR");
	}

	Data = object;
	DataSize = len;

	if (Format == ACS_Old)
	{
		DWORD dirofs = LittleLong(((DWORD *)object)[1]);
		DWORD pretag = ((DWORD *)(object + dirofs))[-1];

		Chunks = object + len;
		// Check for redesigned ACSE/ACSe
		if (dirofs >= 6*4 &&
			(pretag == MAKE_ID('A','C','S','e') ||
			 pretag == MAKE_ID('A','C','S','E')))
		{
			Format = (pretag == MAKE_ID('A','C','S','e')) ? ACS_LittleEnhanced : ACS_Enhanced;
			Chunks = object + LittleLong(((DWORD *)(object + dirofs))[-2]);
			// Forget about the compatibility cruft at the end of the lump
			DataSize = LittleLong(((DWORD *)object)[1]) - 8;
		}
	}
	else
	{
		Chunks = object + LittleLong(((DWORD *)object)[1]);
	}

	LoadScriptsDirectory ();

	if (Format == ACS_Old)
	{
		StringTable = LittleLong(((DWORD *)Data)[1]);
		StringTable += LittleLong(((DWORD *)(Data + StringTable))[0]) * 12 + 4;
		UnescapeStringTable(Data + StringTable, Data, false);
	}
	else
	{
		UnencryptStrings ();
		BYTE *strings = FindChunk (MAKE_ID('S','T','R','L'));
		if (strings != NULL)
		{
			StringTable = DWORD(strings - Data + 8);
			UnescapeStringTable(strings + 8, NULL, true);
		}
		else
		{
			StringTable = 0;
		}
	}

	if (Format == ACS_Old)
	{
		// Do initialization for old-style behavior lumps
		for (i = 0; i < NUM_MAPVARS; ++i)
		{
			MapVars[i] = &MapVarStore[i];
		}
		//LibraryID = StaticModules.Push (this) << LIBRARYID_SHIFT;
	}
	else
	{
		DWORD *chunk;

		// Load functions
		BYTE *funcs;
		Functions = NULL;
		funcs = FindChunk (MAKE_ID('F','U','N','C'));
		if (funcs != NULL)
		{
			NumFunctions = LittleLong(((DWORD *)funcs)[1]) / 8;
			funcs += 8;
			FunctionProfileData = new ACSProfileInfo[NumFunctions];
			Functions = new ScriptFunction[NumFunctions];
			for (i = 0; i < NumFunctions; ++i)
			{
				ScriptFunctionInFile *funcf = &((ScriptFunctionInFile *)funcs)[i];
				ScriptFunction *funcm = &Functions[i];
				funcm->ArgCount = funcf->ArgCount;
				funcm->HasReturnValue = funcf->HasReturnValue;
				funcm->ImportNum = funcf->ImportNum;
				funcm->LocalCount = funcf->LocalCount;
				funcm->Address = LittleLong(funcf->Address);
			}
		}

		// Load local arrays for functions
		if (NumFunctions > 0)
		{
			for (chunk = (DWORD *)FindChunk(MAKE_ID('F','A','R','Y')); chunk != NULL; chunk = (DWORD *)NextChunk((BYTE *)chunk))
			{
				int size = LittleLong(chunk[1]);
				if (size >= 6)
				{
					unsigned int func_num = LittleShort(((WORD *)chunk)[4]);
					if (func_num < (unsigned int)NumFunctions)
					{
						ScriptFunction *func = &Functions[func_num];
						// Unlike scripts, functions do not include their arg count in their local count.
						func->LocalCount = ParseLocalArrayChunk(chunk, &func->LocalArrays, func->LocalCount + func->ArgCount) - func->ArgCount;
					}
				}
			}
		}

		// Load JUMP points
		chunk = (DWORD *)FindChunk (MAKE_ID('J','U','M','P'));
		if (chunk != NULL)
		{
			for (i = 0;i < (int)LittleLong(chunk[1]);i += 4)
				JumpPoints.Push(LittleLong(chunk[2 + i/4]));
		}

		// Initialize this object's map variables
		memset (MapVarStore, 0, sizeof(MapVarStore));
		chunk = (DWORD *)FindChunk (MAKE_ID('M','I','N','I'));
		while (chunk != NULL)
		{
			int numvars = LittleLong(chunk[1])/4 - 1;
			int firstvar = LittleLong(chunk[2]);
			for (i = 0; i < numvars; ++i)
			{
				MapVarStore[i+firstvar] = LittleLong(chunk[3+i]);
			}
			chunk = (DWORD *)NextChunk ((BYTE *)chunk);
		}

		// Initialize this object's map variable pointers to defaults. They can be changed
		// later once the imported modules are loaded.
		for (i = 0; i < NUM_MAPVARS; ++i)
		{
			MapVars[i] = &MapVarStore[i];
		}

		// Create arrays for this module
		chunk = (DWORD *)FindChunk (MAKE_ID('A','R','A','Y'));
		if (chunk != NULL)
		{
			NumArrays = LittleLong(chunk[1])/8;
			ArrayStore = new ArrayInfo[NumArrays];
			memset (ArrayStore, 0, sizeof(*Arrays)*NumArrays);
			for (i = 0; i < NumArrays; ++i)
			{
				MapVarStore[LittleLong(chunk[2+i*2])] = i;
				ArrayStore[i].ArraySize = LittleLong(chunk[3+i*2]);
				ArrayStore[i].Elements = new SDWORD[ArrayStore[i].ArraySize];
				memset(ArrayStore[i].Elements, 0, ArrayStore[i].ArraySize*sizeof(DWORD));
			}
		}

		// Initialize arrays for this module
		chunk = (DWORD *)FindChunk (MAKE_ID('A','I','N','I'));
		while (chunk != NULL)
		{
			int arraynum = MapVarStore[LittleLong(chunk[2])];
			if ((unsigned)arraynum < (unsigned)NumArrays)
			{
				// Use unsigned iterator here to avoid issue with GCC 4.9/5.x
				// optimizer. Might be some undefined behavior in this code,
				// but I don't know what it is.
				unsigned int initsize = MIN<unsigned int> (ArrayStore[arraynum].ArraySize, (LittleLong(chunk[1])-4)/4);
				SDWORD *elems = ArrayStore[arraynum].Elements;
				for (unsigned int j = 0; j < initsize; ++j)
				{
					elems[j] = LittleLong(chunk[3+j]);
				}
			}
			chunk = (DWORD *)NextChunk((BYTE *)chunk);
		}

		// Start setting up array pointers
		NumTotalArrays = NumArrays;
		chunk = (DWORD *)FindChunk (MAKE_ID('A','I','M','P'));
		if (chunk != NULL)
		{
			NumTotalArrays += LittleLong(chunk[2]);
		}
		if (NumTotalArrays != 0)
		{
			Arrays = new ArrayInfo *[NumTotalArrays];
			for (i = 0; i < NumArrays; ++i)
			{
				Arrays[i] = &ArrayStore[i];
			}
		}

		// Tag the library ID to any map variables that are initialized with strings
		if (LibraryID != 0)
		{
			chunk = (DWORD *)FindChunk (MAKE_ID('M','S','T','R'));
			if (chunk != NULL)
			{
				for (DWORD i = 0; i < LittleLong(chunk[1])/4; ++i)
				{
					const char *str = LookupString(MapVarStore[LittleLong(chunk[i+2])]);
					if (str != NULL)
					{
						MapVarStore[LittleLong(chunk[i+2])] = GlobalACSStrings.AddString(str);
					}
				}
			}

			chunk = (DWORD *)FindChunk (MAKE_ID('A','S','T','R'));
			if (chunk != NULL)
			{
				for (DWORD i = 0; i < LittleLong(chunk[1])/4; ++i)
				{
					int arraynum = MapVarStore[LittleLong(chunk[i+2])];
					if ((unsigned)arraynum < (unsigned)NumArrays)
					{
						SDWORD *elems = ArrayStore[arraynum].Elements;
						for (int j = ArrayStore[arraynum].ArraySize; j > 0; --j, ++elems)
						{
//							*elems |= LibraryID;
							const char *str = LookupString(*elems);
							if (str != NULL)
							{
								*elems = GlobalACSStrings.AddString(str);
							}
						}
					}
				}
			}

			// [BL] Newer version of ASTR for structure aware compilers although we only have one array per chunk
			chunk = (DWORD *)FindChunk (MAKE_ID('A','T','A','G'));
			while (chunk != NULL)
			{
				const BYTE* chunkData = (const BYTE*)(chunk + 2);
				// First byte is version, it should be 0
				if(*chunkData++ == 0)
				{
					int arraynum = MapVarStore[uallong(LittleLong(*(const int*)(chunkData)))];
					chunkData += 4;
					if ((unsigned)arraynum < (unsigned)NumArrays)
					{
						SDWORD *elems = ArrayStore[arraynum].Elements;
						// Ending zeros may be left out.
						for (int j = MIN(LittleLong(chunk[1])-5, ArrayStore[arraynum].ArraySize); j > 0; --j, ++elems, ++chunkData)
						{
							// For ATAG, a value of 0 = Integer, 1 = String, 2 = FunctionPtr
							// Our implementation uses the same tags for both String and FunctionPtr
							if (*chunkData == 2)
							{
								*elems |= LibraryID;
							}
							else if (*chunkData == 1)
							{
								const char *str = LookupString(*elems);
								if (str != NULL)
								{
									*elems = GlobalACSStrings.AddString(str);
								}
							}
						}
					}
				}

				chunk = (DWORD *)NextChunk ((BYTE *)chunk);
			}
		}

		// Load required libraries.
		if (NULL != (chunk = (DWORD *)FindChunk (MAKE_ID('L','O','A','D'))))
		{
			const char *const parse = (char *)&chunk[2];
			DWORD i;

			for (i = 0; i < LittleLong(chunk[1]); )
			{
				if (parse[i])
				{
					FBehavior *module = NULL;
					int lump = Wads.CheckNumForName (&parse[i], ns_acslibrary);
					if (lump < 0)
					{
						Printf (TEXTCOLOR_RED "Could not find ACS library %s.\n", &parse[i]);
					}
					else
					{
						module = StaticLoadModule (lump);
					}
					if (module != NULL) Imports.Push (module);
					do {;} while (parse[++i]);
				}
				++i;
			}

			// Go through each imported module in order and resolve all imported functions
			// and map variables.
			for (i = 0; i < Imports.Size(); ++i)
			{
				FBehavior *lib = Imports[i];
				int j;

				if (lib == NULL)
					continue;

				// Resolve functions
				chunk = (DWORD *)FindChunk(MAKE_ID('F','N','A','M'));
				for (j = 0; j < NumFunctions; ++j)
				{
					ScriptFunction *func = &((ScriptFunction *)Functions)[j];
					if (func->Address == 0 && func->ImportNum == 0)
					{
						int libfunc = lib->FindFunctionName ((char *)(chunk + 2) + LittleLong(chunk[3+j]));
						if (libfunc >= 0)
						{
							ScriptFunction *realfunc = &((ScriptFunction *)lib->Functions)[libfunc];
							// Make sure that the library really defines this function. It might simply
							// be importing it itself.
							if (realfunc->Address != 0 && realfunc->ImportNum == 0)
							{
								func->Address = libfunc;
								func->ImportNum = i+1;
								if (realfunc->ArgCount != func->ArgCount)
								{
									Printf (TEXTCOLOR_ORANGE "Function %s in %s has %d arguments. %s expects it to have %d.\n",
										(char *)(chunk + 2) + LittleLong(chunk[3+j]), lib->ModuleName, realfunc->ArgCount,
										ModuleName, func->ArgCount);
									Format = ACS_Unknown;
								}
								// The next two properties do not affect code compatibility, so it is
								// okay for them to be different in the imported module than they are
								// in this one, as long as we make sure to use the real values.
								func->LocalCount = LittleLong(realfunc->LocalCount);
								func->HasReturnValue = realfunc->HasReturnValue;
							}
						}
					}
				}

				// Resolve map variables
				chunk = (DWORD *)FindChunk(MAKE_ID('M','I','M','P'));
				if (chunk != NULL)
				{
					char *parse = (char *)&chunk[2];
					for (DWORD j = 0; j < LittleLong(chunk[1]); )
					{
						DWORD varNum = LittleLong(*(DWORD *)&parse[j]);
						j += 4;
						int impNum = lib->FindMapVarName (&parse[j]);
						if (impNum >= 0)
						{
							MapVars[varNum] = &lib->MapVarStore[impNum];
						}
						do {;} while (parse[++j]);
						++j;
					}
				}

				// Resolve arrays
				if (NumTotalArrays > NumArrays)
				{
					chunk = (DWORD *)FindChunk(MAKE_ID('A','I','M','P'));
					char *parse = (char *)&chunk[3];
					for (DWORD j = 0; j < LittleLong(chunk[2]); ++j)
					{
						DWORD varNum = LittleLong(*(DWORD *)parse);
						parse += 4;
						DWORD expectedSize = LittleLong(*(DWORD *)parse);
						parse += 4;
						int impNum = lib->FindMapArray (parse);
						if (impNum >= 0)
						{
							Arrays[NumArrays + j] = &lib->ArrayStore[impNum];
							MapVarStore[varNum] = NumArrays + j;
							if (lib->ArrayStore[impNum].ArraySize != expectedSize)
							{
								Format = ACS_Unknown;
								Printf (TEXTCOLOR_ORANGE "The array %s in %s has %u elements, but %s expects it to only have %u.\n",
									parse, lib->ModuleName, lib->ArrayStore[impNum].ArraySize,
									ModuleName, expectedSize);
							}
						}
						do {;} while (*++parse);
						++parse;
					}
				}
			}
		}
	}

	DPrintf (DMSG_NOTIFY, "Loaded %d scripts, %d functions\n", NumScripts, NumFunctions);
	return true;
}